

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::Promise<kj::HttpClient::WebSocketResponse>_> * __thiscall
kj::_::NullableValue<kj::Promise<kj::HttpClient::WebSocketResponse>_>::operator=
          (NullableValue<kj::Promise<kj::HttpClient::WebSocketResponse>_> *this,
          NullableValue<kj::Promise<kj::HttpClient::WebSocketResponse>_> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&(this->field_1).value);
    }
    if (other->isSet == true) {
      this->field_1 = other->field_1;
      other->field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpClient::WebSocketResponse>_>_2
            )0x0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }